

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O0

bool __thiscall
stk::FileRead::getRawInfo
          (FileRead *this,char *fileName,uint nChannels,StkFormat format,StkFloat rate)

{
  int iVar1;
  ostream *poVar2;
  int local_cc;
  undefined1 local_c8 [4];
  int sampleBytes;
  stat filestat;
  StkFloat rate_local;
  StkFormat format_local;
  uint nChannels_local;
  char *fileName_local;
  FileRead *this_local;
  
  filestat.__glibc_reserved[2] = (__syscall_slong_t)rate;
  iVar1 = stat(fileName,(stat *)local_c8);
  if (iVar1 == -1) {
    poVar2 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileRead: Could not stat RAW file (");
    poVar2 = std::operator<<(poVar2,fileName);
    std::operator<<(poVar2,").");
    this_local._7_1_ = false;
  }
  else if (nChannels == 0) {
    poVar2 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileRead: number of channels can\'t be 0 (");
    poVar2 = std::operator<<(poVar2,fileName);
    std::operator<<(poVar2,").");
    this_local._7_1_ = false;
  }
  else {
    this->dataOffset_ = 0;
    this->channels_ = nChannels;
    this->dataType_ = format;
    this->fileRate_ = (StkFloat)filestat.__glibc_reserved[2];
    if (format == 1) {
      local_cc = 1;
    }
    else if (format == 2) {
      local_cc = 2;
    }
    else if ((format == 8) || (format == 0x10)) {
      local_cc = 4;
    }
    else {
      if (format != 0x20) {
        poVar2 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: StkFormat ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,format);
        poVar2 = std::operator<<(poVar2," is invalid (");
        poVar2 = std::operator<<(poVar2,fileName);
        std::operator<<(poVar2,").");
        return false;
      }
      local_cc = 8;
    }
    this->fileSize_ = ((long)filestat.st_rdev / (long)local_cc) / (long)(ulong)this->channels_;
    this->byteswap_ = false;
    this->byteswap_ = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FileRead :: getRawInfo( const char *fileName, unsigned int nChannels, StkFormat format, StkFloat rate )
{
  // Use the system call "stat" to determine the file length.
  struct stat filestat;
  if ( stat(fileName, &filestat) == -1 ) {
    oStream_ << "FileRead: Could not stat RAW file (" << fileName << ").";
    return false;
  }
  if ( nChannels == 0 ) {
    oStream_ << "FileRead: number of channels can't be 0 (" << fileName << ").";
    return false;
  }

  // Rawwave files have no header and by default, are assumed to
  // contain a monophonic stream of 16-bit signed integers in
  // big-endian byte order at a sample rate of 22050 Hz.  However,
  // different parameters can be specified if desired.
  dataOffset_ = 0;
  channels_ = nChannels;
  dataType_ = format;
  fileRate_ = rate;
  int sampleBytes = 0;
  if ( format == STK_SINT8 ) sampleBytes = 1;
  else if ( format == STK_SINT16 ) sampleBytes = 2;
  else if ( format == STK_SINT32 || format == STK_FLOAT32 ) sampleBytes = 4;
  else if ( format == STK_FLOAT64 ) sampleBytes = 8;
  else {
    oStream_ << "FileRead: StkFormat " << format << " is invalid (" << fileName << ").";
    return false;
  }

  fileSize_ = (long) filestat.st_size / sampleBytes / channels_;  // length in frames

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  return true;
}